

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int declClose(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  code *pcVar1;
  int iVar2;
  
  if (tok == 0xf) {
    return 0;
  }
  if (tok == 0x11) {
    pcVar1 = internalSubset;
    if (state->documentEntity == 0) {
      pcVar1 = externalSubset1;
    }
    iVar2 = 0;
  }
  else {
    iVar2 = -1;
    pcVar1 = error;
    if ((tok == 0x1c) && (state->documentEntity == 0)) {
      return 0x34;
    }
  }
  state->handler = pcVar1;
  return iVar2;
}

Assistant:

static
int declClose(PROLOG_STATE *state,
              int tok,
              const char *ptr,
              const char *end,
              const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_DECL_CLOSE:
    setTopLevel(state);
    return XML_ROLE_NONE;
  }
  return common(state, tok);
}